

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceMatrixDecomposition::distributeInitialData(ForceMatrixDecomposition *this)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  vector<int,std::allocator<int>> *pvVar2;
  SnapshotManager *pSVar3;
  Snapshot *this_00;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  SimInfo *pSVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  AtomType *pAVar13;
  int iVar14;
  long lVar15;
  size_type __new_size;
  iterator iVar16;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  int local_9c;
  vector<double,_std::allocator<double>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  long local_50;
  PairList *local_48;
  PairList *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  pSVar3 = (this->super_ForceDecomposition).sman_;
  this_00 = pSVar3->currentSnapshot_;
  (this->super_ForceDecomposition).snap_ = this_00;
  (this->super_ForceDecomposition).atomStorageLayout_ = pSVar3->atomStorageLayout_;
  (this->super_ForceDecomposition).ff_ = ((this->super_ForceDecomposition).info_)->forceField_;
  iVar10 = Snapshot::getNumberOfAtoms(this_00);
  this->nLocal_ = iVar10;
  uVar11 = SimInfo::getNLocalCutoffGroups((this->super_ForceDecomposition).info_);
  this->nGroups_ = uVar11;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,&((this->super_ForceDecomposition).info_)->identArray_);
  piVar4 = (this->super_ForceDecomposition).idents.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->super_ForceDecomposition).idents.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_ForceDecomposition).idents.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->super_ForceDecomposition).idents.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->super_ForceDecomposition).idents.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((piVar4 != (pointer)0x0) &&
     (operator_delete(piVar4,(long)piVar5 - (long)piVar4),
     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     != (pointer)0x0)) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,&((this->super_ForceDecomposition).info_)->regions_);
  piVar4 = (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((piVar4 != (pointer)0x0) &&
     (operator_delete(piVar4,(long)piVar5 - (long)piVar4),
     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     != (pointer)0x0)) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SimInfo::getGlobalAtomIndices(&local_78,(this->super_ForceDecomposition).info_);
  piVar4 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((piVar4 != (pointer)0x0) &&
     (operator_delete(piVar4,(long)piVar5 - (long)piVar4),
     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     != (pointer)0x0)) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SimInfo::getGlobalGroupIndices(&local_78,(this->super_ForceDecomposition).info_);
  piVar4 = (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((piVar4 != (pointer)0x0) &&
     (operator_delete(piVar4,(long)piVar5 - (long)piVar4),
     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     != (pointer)0x0)) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,&((this->super_ForceDecomposition).info_)->globalGroupMembership_);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,&((this->super_ForceDecomposition).info_)->massFactors_);
  pdVar6 = (this->super_ForceDecomposition).massFactors.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7 = (this->super_ForceDecomposition).massFactors.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->super_ForceDecomposition).massFactors.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->super_ForceDecomposition).massFactors.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->super_ForceDecomposition).massFactors.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar6 != (pointer)0x0) &&
     (operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6),
     local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pSVar8 = (this->super_ForceDecomposition).info_;
  DataStorage::setStorageLayout
            (&((this->super_ForceDecomposition).snap_)->cgData,
             (uint)(this->super_ForceDecomposition).needVelocities_ * 2 + 1);
  pvVar1 = &(this->super_ForceDecomposition).excludesForAtom;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar1,(this->super_ForceDecomposition).excludesForAtom.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_38 = pvVar1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nLocal_);
  pvVar1 = &(this->super_ForceDecomposition).toposForAtom;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar1,(this->super_ForceDecomposition).toposForAtom.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_58 = pvVar1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nLocal_);
  pvVar1 = &(this->super_ForceDecomposition).topoDist;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar1,(this->super_ForceDecomposition).topoDist.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_60 = pvVar1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nLocal_);
  iVar10 = this->nLocal_;
  __new_size = (size_type)iVar10;
  if (0 < (long)__new_size) {
    local_40 = &pSVar8->oneThreeInteractions_;
    local_48 = &pSVar8->oneFourInteractions_;
    lVar15 = 0;
    do {
      iVar12 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_50 = lVar15;
      if (0 < iVar10) {
        iVar14 = 0;
        do {
          iVar10 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar14];
          bVar9 = PairList::hasPair(&pSVar8->excludedInteractions_,iVar12,iVar10);
          if (bVar9) {
            pvVar2 = (vector<int,std::allocator<int>> *)
                     ((local_38->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar15);
            iVar16._M_current = *(int **)(pvVar2 + 8);
            if (iVar16._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar16,(int *)&local_98);
            }
            else {
              *iVar16._M_current =
                   (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(int **)(pvVar2 + 8) = iVar16._M_current + 1;
            }
          }
          bVar9 = PairList::hasPair(&pSVar8->oneTwoInteractions_,iVar12,iVar10);
          if (bVar9) {
            pvVar2 = (vector<int,std::allocator<int>> *)
                     ((local_58->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar15);
            iVar16._M_current = *(int **)(pvVar2 + 8);
            if (iVar16._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar16,(int *)&local_98);
            }
            else {
              *iVar16._M_current =
                   (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(int **)(pvVar2 + 8) = iVar16._M_current + 1;
            }
            this_01 = (local_60->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar15;
            local_9c = 1;
            iVar16._M_current =
                 (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar16._M_current ==
                (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (this_01,iVar16,&local_9c);
            }
            else {
              *iVar16._M_current = 1;
LAB_001417a9:
              (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar16._M_current + 1;
            }
          }
          else {
            bVar9 = PairList::hasPair(local_40,iVar12,iVar10);
            if (bVar9) {
              pvVar2 = (vector<int,std::allocator<int>> *)
                       ((local_58->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar15);
              iVar16._M_current = *(int **)(pvVar2 + 8);
              if (iVar16._M_current == *(int **)(pvVar2 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar2,iVar16,(int *)&local_98);
              }
              else {
                *iVar16._M_current =
                     (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                *(int **)(pvVar2 + 8) = iVar16._M_current + 1;
              }
              this_01 = (local_60->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar15;
              local_9c = 2;
              iVar16._M_current =
                   (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar16._M_current !=
                  (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar16._M_current = 2;
                goto LAB_001417a9;
              }
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (this_01,iVar16,&local_9c);
            }
            else {
              bVar9 = PairList::hasPair(local_48,iVar12,iVar10);
              if (bVar9) {
                pvVar2 = (vector<int,std::allocator<int>> *)
                         ((local_58->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar15);
                iVar16._M_current = *(int **)(pvVar2 + 8);
                if (iVar16._M_current == *(int **)(pvVar2 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar2,iVar16,(int *)&local_98);
                }
                else {
                  *iVar16._M_current =
                       (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  *(int **)(pvVar2 + 8) = iVar16._M_current + 1;
                }
                this_01 = (local_60->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar15;
                local_9c = 3;
                iVar16._M_current =
                     (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar16._M_current !=
                    (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  *iVar16._M_current = 3;
                  goto LAB_001417a9;
                }
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (this_01,iVar16,&local_9c);
              }
            }
          }
          iVar14 = (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + 1;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_98.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar14);
          iVar10 = this->nLocal_;
        } while (iVar14 < iVar10);
      }
      lVar15 = local_50 + 1;
      __new_size = (size_type)iVar10;
    } while (lVar15 < (long)__new_size);
  }
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::resize
            (&(this->super_ForceDecomposition).atypesLocal,__new_size);
  if (0 < this->nLocal_) {
    lVar15 = 0;
    do {
      pAVar13 = ForceField::getAtomType
                          ((this->super_ForceDecomposition).ff_,
                           (this->super_ForceDecomposition).idents.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar15]);
      (this->super_ForceDecomposition).atypesLocal.
      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar15] = pAVar13;
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->nLocal_);
  }
  pvVar1 = &(this->super_ForceDecomposition).groupList_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar1,(this->super_ForceDecomposition).groupList_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nGroups_);
  iVar10 = this->nGroups_;
  if (0 < iVar10) {
    iVar12 = this->nLocal_;
    lVar15 = 0;
    do {
      iVar14 = (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      if (0 < iVar12) {
        iVar10 = 0;
        do {
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[(this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar10]] == iVar14) {
            pvVar2 = (vector<int,std::allocator<int>> *)
                     ((pvVar1->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar15);
            iVar16._M_current = *(int **)(pvVar2 + 8);
            if (iVar16._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar16,(int *)&local_98);
            }
            else {
              *iVar16._M_current = iVar10;
              *(int **)(pvVar2 + 8) = iVar16._M_current + 1;
            }
          }
          iVar10 = (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + 1;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_98.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
          iVar12 = this->nLocal_;
        } while (iVar10 < iVar12);
        iVar10 = this->nGroups_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar10);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::distributeInitialData() {
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();
    ff_                = info_->getForceField();
    nLocal_            = snap_->getNumberOfAtoms();

    nGroups_ = info_->getNLocalCutoffGroups();
    // gather the information for atomtype IDs (atids):
    idents                            = info_->getIdentArray();
    regions                           = info_->getRegions();
    AtomLocalToGlobal                 = info_->getGlobalAtomIndices();
    cgLocalToGlobal                   = info_->getGlobalGroupIndices();
    vector<int> globalGroupMembership = info_->getGlobalGroupMembership();

    massFactors = info_->getMassFactors();

    PairList* excludes = info_->getExcludedInteractions();
    PairList* oneTwo   = info_->getOneTwoInteractions();
    PairList* oneThree = info_->getOneThreeInteractions();
    PairList* oneFour  = info_->getOneFourInteractions();

    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);
    else
      snap_->cgData.setStorageLayout(DataStorage::dslPosition);

#ifdef IS_MPI

    MPI_Comm row = rowComm.getComm();
    MPI_Comm col = colComm.getComm();

    AtomPlanIntRow    = new Plan<int>(row, nLocal_);
    AtomPlanRealRow   = new Plan<RealType>(row, nLocal_);
    AtomPlanVectorRow = new Plan<Vector3d>(row, nLocal_);
    AtomPlanMatrixRow = new Plan<Mat3x3d>(row, nLocal_);
    AtomPlanPotRow    = new Plan<potVec>(row, nLocal_);

    AtomPlanIntColumn    = new Plan<int>(col, nLocal_);
    AtomPlanRealColumn   = new Plan<RealType>(col, nLocal_);
    AtomPlanVectorColumn = new Plan<Vector3d>(col, nLocal_);
    AtomPlanMatrixColumn = new Plan<Mat3x3d>(col, nLocal_);
    AtomPlanPotColumn    = new Plan<potVec>(col, nLocal_);

    cgPlanIntRow       = new Plan<int>(row, nGroups_);
    cgPlanVectorRow    = new Plan<Vector3d>(row, nGroups_);
    cgPlanIntColumn    = new Plan<int>(col, nGroups_);
    cgPlanVectorColumn = new Plan<Vector3d>(col, nGroups_);

    nAtomsInRow_  = AtomPlanIntRow->getSize();
    nAtomsInCol_  = AtomPlanIntColumn->getSize();
    nGroupsInRow_ = cgPlanIntRow->getSize();
    nGroupsInCol_ = cgPlanIntColumn->getSize();

    // Modify the data storage objects with the correct layouts and sizes:
    atomRowData.resize(nAtomsInRow_);
    atomRowData.setStorageLayout(atomStorageLayout_);
    atomColData.resize(nAtomsInCol_);
    atomColData.setStorageLayout(atomStorageLayout_);
    cgRowData.resize(nGroupsInRow_);
    cgRowData.setStorageLayout(DataStorage::dslPosition);
    cgColData.resize(nGroupsInCol_);
    if (needVelocities_)
      // we only need column velocities if we need them.
      cgColData.setStorageLayout(DataStorage::dslPosition |
                                 DataStorage::dslVelocity);
    else
      cgColData.setStorageLayout(DataStorage::dslPosition);

    identsRow.resize(nAtomsInRow_);
    identsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(idents, identsRow);
    AtomPlanIntColumn->gather(idents, identsCol);

    regionsRow.resize(nAtomsInRow_);
    regionsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(regions, regionsRow);
    AtomPlanIntColumn->gather(regions, regionsCol);

    // allocate memory for the parallel objects
    atypesRow.resize(nAtomsInRow_);
    atypesCol.resize(nAtomsInCol_);

    for (int i = 0; i < nAtomsInRow_; i++)
      atypesRow[i] = ff_->getAtomType(identsRow[i]);
    for (int i = 0; i < nAtomsInCol_; i++)
      atypesCol[i] = ff_->getAtomType(identsCol[i]);

    pot_row.resize(nAtomsInRow_);
    pot_col.resize(nAtomsInCol_);

    expot_row.resize(nAtomsInRow_);
    expot_col.resize(nAtomsInCol_);

    selepot_row.resize(nAtomsInRow_);
    selepot_col.resize(nAtomsInCol_);

    AtomRowToGlobal.resize(nAtomsInRow_);
    AtomColToGlobal.resize(nAtomsInCol_);
    AtomPlanIntRow->gather(AtomLocalToGlobal, AtomRowToGlobal);
    AtomPlanIntColumn->gather(AtomLocalToGlobal, AtomColToGlobal);

    cgRowToGlobal.resize(nGroupsInRow_);
    cgColToGlobal.resize(nGroupsInCol_);
    cgPlanIntRow->gather(cgLocalToGlobal, cgRowToGlobal);
    cgPlanIntColumn->gather(cgLocalToGlobal, cgColToGlobal);

    massFactorsRow.resize(nAtomsInRow_);
    massFactorsCol.resize(nAtomsInCol_);
    AtomPlanRealRow->gather(massFactors, massFactorsRow);
    AtomPlanRealColumn->gather(massFactors, massFactorsCol);

    groupListRow_.clear();
    groupListRow_.resize(nGroupsInRow_);
    for (int i = 0; i < nGroupsInRow_; i++) {
      int gid = cgRowToGlobal[i];
      for (int j = 0; j < nAtomsInRow_; j++) {
        int aid = AtomRowToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListRow_[i].push_back(j);
      }
    }

    groupListCol_.clear();
    groupListCol_.resize(nGroupsInCol_);
    for (int i = 0; i < nGroupsInCol_; i++) {
      int gid = cgColToGlobal[i];
      for (int j = 0; j < nAtomsInCol_; j++) {
        int aid = AtomColToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListCol_[i].push_back(j);
      }
    }

    excludesForAtom.clear();
    excludesForAtom.resize(nAtomsInRow_);
    toposForAtom.clear();
    toposForAtom.resize(nAtomsInRow_);
    topoDist.clear();
    topoDist.resize(nAtomsInRow_);
    for (int i = 0; i < nAtomsInRow_; i++) {
      int iglob = AtomRowToGlobal[i];

      for (int j = 0; j < nAtomsInCol_; j++) {
        int jglob = AtomColToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }

#else
    excludesForAtom.clear();
    excludesForAtom.resize(nLocal_);
    toposForAtom.clear();
    toposForAtom.resize(nLocal_);
    topoDist.clear();
    topoDist.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++) {
      int iglob = AtomLocalToGlobal[i];

      for (int j = 0; j < nLocal_; j++) {
        int jglob = AtomLocalToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }
#endif

    // allocate memory for the parallel objects
    atypesLocal.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++)
      atypesLocal[i] = ff_->getAtomType(idents[i]);

    groupList_.clear();
    groupList_.resize(nGroups_);
    for (int i = 0; i < nGroups_; i++) {
      int gid = cgLocalToGlobal[i];
      for (int j = 0; j < nLocal_; j++) {
        int aid = AtomLocalToGlobal[j];
        if (globalGroupMembership[aid] == gid) { groupList_[i].push_back(j); }
      }
    }
  }